

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

string * __thiscall
duckdb_parquet::to_string_abi_cxx11_(string *__return_storage_ptr__,duckdb_parquet *this,type *val)

{
  uint uVar1;
  uint __val;
  uint uVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  uint __len;
  allocator local_21;
  
  uVar1 = *(uint *)this;
  if (_FieldRepetitionType_VALUES_TO_NAMES._16_8_ != 0) {
    lVar3 = 0x4a94a8;
    lVar5 = _FieldRepetitionType_VALUES_TO_NAMES._16_8_;
    do {
      if ((int)uVar1 <= *(int *)(lVar5 + 0x20)) {
        lVar3 = lVar5;
      }
      lVar5 = *(long *)(lVar5 + 0x10 + (ulong)(*(int *)(lVar5 + 0x20) < (int)uVar1) * 8);
    } while (lVar5 != 0);
    if ((lVar3 != 0x4a94a8) && (*(int *)(lVar3 + 0x20) <= (int)uVar1)) {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,*(char **)(lVar3 + 0x28),&local_21);
      return __return_storage_ptr__;
    }
  }
  __val = -uVar1;
  if (0 < (int)uVar1) {
    __val = uVar1;
  }
  __len = 1;
  if (9 < __val) {
    uVar6 = (ulong)__val;
    uVar2 = 4;
    do {
      __len = uVar2;
      uVar4 = (uint)uVar6;
      if (uVar4 < 100) {
        __len = __len - 2;
        goto LAB_002c1299;
      }
      if (uVar4 < 1000) {
        __len = __len - 1;
        goto LAB_002c1299;
      }
      if (uVar4 < 10000) goto LAB_002c1299;
      uVar6 = uVar6 / 10000;
      uVar2 = __len + 4;
    } while (99999 < uVar4);
    __len = __len + 1;
  }
LAB_002c1299:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct
            ((ulong)__return_storage_ptr__,(char)__len - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((__return_storage_ptr__->_M_dataplus)._M_p + (uVar1 >> 0x1f),__len,__val);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const FieldRepetitionType::type& val) {
  std::map<int, const char*>::const_iterator it = _FieldRepetitionType_VALUES_TO_NAMES.find(val);
  if (it != _FieldRepetitionType_VALUES_TO_NAMES.end()) {
    return std::string(it->second);
  } else {
    return std::to_string(static_cast<int>(val));
  }
}